

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

int __thiscall prometheus::Gateway::push(Gateway *this,HttpMethod method)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer this_00;
  undefined1 local_d0 [4];
  int status_code;
  string uri;
  Serializer local_b0;
  string body;
  undefined1 local_90 [8];
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  undefined1 local_70 [8];
  shared_ptr<prometheus::Collectable> collectable;
  pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *wcollectable;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  TextSerializer serializer;
  HttpMethod method_local;
  Gateway *this_local;
  
  lock._M_device = (mutex_type *)0x0;
  TextSerializer::TextSerializer((TextSerializer *)&lock);
  ::std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mutex_);
  __end1 = ::std::
           vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->collectables_);
  wcollectable = (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)::std::
                    vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(&this->collectables_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&wcollectable), bVar1) {
    collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end1);
    ::std::weak_ptr<prometheus::Collectable>::lock((weak_ptr<prometheus::Collectable> *)local_70);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
    if (bVar1) {
      peVar3 = ::std::
               __shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
      (*peVar3->_vptr_Collectable[2])(local_90);
      Serializer::Serialize_abi_cxx11_
                (&local_b0,
                 (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 &lock);
      getUri((Gateway *)local_d0,(CollectableEntry *)this);
      this_00 = ::std::
                unique_ptr<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                ::operator->(&this->curlWrapper_);
      iVar2 = detail::CurlWrapper::performHttpRequest
                        (this_00,method,(string *)local_d0,(string *)&local_b0);
      if ((iVar2 < 100) || (399 < iVar2)) {
        metrics.
        super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        this_local._4_4_ = iVar2;
      }
      else {
        metrics.
        super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      ::std::__cxx11::string::~string((string *)local_d0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 local_90);
    }
    else {
      metrics.
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
    }
    ::std::shared_ptr<prometheus::Collectable>::~shared_ptr
              ((shared_ptr<prometheus::Collectable> *)local_70);
    if ((metrics.
         super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) &&
       (metrics.
        super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 3)) goto LAB_0010b07f;
    __gnu_cxx::
    __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._4_4_ = 200;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_0010b07f:
  ::std::lock_guard<std::mutex>::~lock_guard(&local_30);
  TextSerializer::~TextSerializer((TextSerializer *)&lock);
  return this_local._4_4_;
}

Assistant:

int Gateway::push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = serializer.Serialize(metrics);
    auto uri = getUri(wcollectable);
    auto status_code = curlWrapper_->performHttpRequest(method, uri, body);

    if (status_code < 100 || status_code >= 400) {
      return status_code;
    }
  }

  return 200;
}